

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

int Io_MvReadInterfaces(Io_MvMan_t *p)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Io_MvMod_t *p_00;
  char *pcVar4;
  int local_30;
  int nOutsOld;
  int k;
  int i;
  char *pLine;
  Io_MvMod_t *pMod;
  Io_MvMan_t *p_local;
  
  nOutsOld = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vModels);
    if (iVar1 <= nOutsOld) {
      return 1;
    }
    p_00 = (Io_MvMod_t *)Vec_PtrEntry(p->vModels,nOutsOld);
    iVar1 = Io_MvParseLineModel(p_00,p_00->pName);
    if (iVar1 == 0) break;
    iVar1 = Abc_DesAddModel(p->pDesign,p_00->pNtk);
    if (iVar1 == 0) {
      uVar2 = Io_MvGetLine(p,p_00->pName);
      sprintf(p->sError,"Line %d: Model %s is defined twice.",(ulong)uVar2,p_00->pName);
      return 0;
    }
    for (local_30 = 0; iVar1 = Vec_PtrSize(p_00->vInputs), local_30 < iVar1; local_30 = local_30 + 1
        ) {
      pcVar4 = (char *)Vec_PtrEntry(p_00->vInputs,local_30);
      iVar1 = Io_MvParseLineInputs(p_00,pcVar4);
      if (iVar1 == 0) {
        return 0;
      }
    }
    for (local_30 = 0; iVar1 = Vec_PtrSize(p_00->vOutputs), local_30 < iVar1;
        local_30 = local_30 + 1) {
      pcVar4 = (char *)Vec_PtrEntry(p_00->vOutputs,local_30);
      iVar1 = Io_MvParseLineOutputs(p_00,pcVar4);
      if (iVar1 == 0) {
        return 0;
      }
    }
    iVar1 = Abc_NtkPoNum(p_00->pNtk);
    for (local_30 = 0; iVar3 = Vec_PtrSize(p_00->vConstrs), local_30 < iVar3;
        local_30 = local_30 + 1) {
      pcVar4 = (char *)Vec_PtrEntry(p_00->vConstrs,local_30);
      iVar3 = Io_MvParseLineConstrs(p_00,pcVar4);
      if (iVar3 == 0) {
        return 0;
      }
    }
    iVar3 = Abc_NtkPoNum(p_00->pNtk);
    p_00->pNtk->nConstrs = iVar3 - iVar1;
    for (local_30 = 0; iVar1 = Vec_PtrSize(p_00->vLtlProperties), local_30 < iVar1;
        local_30 = local_30 + 1) {
      pcVar4 = (char *)Vec_PtrEntry(p_00->vLtlProperties,local_30);
      iVar1 = Io_MvParseLineLtlProperty(p_00,pcVar4);
      if (iVar1 == 0) {
        return 0;
      }
    }
    nOutsOld = nOutsOld + 1;
  }
  return 0;
}

Assistant:

static int Io_MvReadInterfaces( Io_MvMan_t * p )
{
    Io_MvMod_t * pMod;
    char * pLine;
    int i, k, nOutsOld;
    // iterate through the models
    Vec_PtrForEachEntry( Io_MvMod_t *, p->vModels, pMod, i )
    {
        // parse the model
        if ( !Io_MvParseLineModel( pMod, pMod->pName ) )
            return 0;
        // add model to the design
        if ( !Abc_DesAddModel( p->pDesign, pMod->pNtk ) )
        {
            sprintf( p->sError, "Line %d: Model %s is defined twice.", Io_MvGetLine(p, pMod->pName), pMod->pName );
            return 0;
        }
        // parse the inputs
        Vec_PtrForEachEntry( char *, pMod->vInputs, pLine, k )
            if ( !Io_MvParseLineInputs( pMod, pLine ) )
                return 0;
        // parse the outputs
        Vec_PtrForEachEntry( char *, pMod->vOutputs, pLine, k )
            if ( !Io_MvParseLineOutputs( pMod, pLine ) )
                return 0;
        // parse the constraints
        nOutsOld = Abc_NtkPoNum(pMod->pNtk);
        Vec_PtrForEachEntry( char *, pMod->vConstrs, pLine, k )
            if ( !Io_MvParseLineConstrs( pMod, pLine ) )
                return 0;
        pMod->pNtk->nConstrs = Abc_NtkPoNum(pMod->pNtk) - nOutsOld;
		Vec_PtrForEachEntry( char *, pMod->vLtlProperties, pLine, k )
			if ( !Io_MvParseLineLtlProperty( pMod, pLine ) )
                return 0;
        // report the results
#ifdef IO_VERBOSE_OUTPUT
        if ( Vec_PtrSize(p->vModels) > 1 )
		    printf( "Parsed %-32s: PI =%6d  PO =%6d  ND =%8d  FF =%6d  B =%6d\n", 
			    pMod->pNtk->pName, Abc_NtkPiNum(pMod->pNtk), Abc_NtkPoNum(pMod->pNtk),
			    Vec_PtrSize(pMod->vNames), Vec_PtrSize(pMod->vLatches), Vec_PtrSize(pMod->vSubckts) );
#endif
    }
    return 1;
}